

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_73520::PyListCtrlPMatchSource<cpsm::FilenameOnlyMatch>::fill
          (PyListCtrlPMatchSource<cpsm::FilenameOnlyMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          *items)

{
  pointer *ppPVar1;
  long lVar2;
  pointer pPVar3;
  pointer pPVar4;
  size_t sVar5;
  int iVar6;
  Obj p_Var7;
  char *pcVar8;
  ulong uVar9;
  pointer pPVar10;
  pointer pPVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  pointer pPVar16;
  bool bVar17;
  size_t local_38;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
LAB_00123ff6:
    std::__throw_length_error("vector::_M_realloc_insert");
  }
  if (this->done_ == false) {
    lVar15 = this->i_;
    lVar2 = this->size_;
    lVar12 = lVar15 + 0x200;
    if (lVar2 < lVar15 + 0x200) {
      lVar12 = lVar2;
    }
    if (lVar15 < lVar2) {
      do {
        p_Var7 = (Obj)PyList_GetItem(this->list_);
        if ((p_Var7 == (Obj)0x0) ||
           (pcVar8 = (char *)PyUnicode_AsUTF8AndSize(p_Var7,&local_38), sVar5 = local_38,
           pcVar8 == (char *)0x0)) {
LAB_00123fcb:
          this->done_ = true;
          goto LAB_00123fd4;
        }
        pPVar3 = (items->
                 super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar3 == (items->
                      super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pPVar4 = (items->
                   super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)pPVar3 - (long)pPVar4 == 0x7ffffffffffffff8) goto LAB_00123ff6;
          lVar15 = (long)pPVar3 - (long)pPVar4 >> 3;
          uVar14 = lVar15 * -0x5555555555555555;
          uVar9 = uVar14;
          if (pPVar3 == pPVar4) {
            uVar9 = 1;
          }
          uVar13 = uVar9 + uVar14;
          if (0x555555555555554 < uVar13) {
            uVar13 = 0x555555555555555;
          }
          if (CARRY8(uVar9,uVar14)) {
            uVar13 = 0x555555555555555;
          }
          if (uVar13 == 0) {
            pPVar10 = (pointer)0x0;
          }
          else {
            pPVar10 = (pointer)operator_new(uVar13 * 0x18);
          }
          *(char **)((long)&(pPVar10->inner).inner.item_ + lVar15 * 8) = pcVar8;
          *(size_t *)((long)&(pPVar10->inner).inner.item_ + lVar15 * 8 + 8) = sVar5;
          (&pPVar10->obj)[lVar15] = p_Var7;
          pPVar16 = pPVar10;
          for (pPVar11 = pPVar4; pPVar3 != pPVar11; pPVar11 = pPVar11 + 1) {
            pPVar16->obj = pPVar11->obj;
            sVar5 = (pPVar11->inner).inner.item_.len_;
            (pPVar16->inner).inner.item_.ptr_ = (pPVar11->inner).inner.item_.ptr_;
            *(size_t *)((long)&(pPVar16->inner).inner.item_ + 8) = sVar5;
            pPVar16 = pPVar16 + 1;
          }
          if (pPVar4 != (pointer)0x0) {
            operator_delete(pPVar4);
          }
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_start = pPVar10;
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pPVar16 + 1;
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar10 + uVar13;
        }
        else {
          (pPVar3->inner).inner.item_.ptr_ = pcVar8;
          (pPVar3->inner).inner.item_.len_ = local_38;
          pPVar3->obj = p_Var7;
          ppPVar1 = &(items->
                     super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + 1;
        }
        if (pcVar8 == (char *)0x0) goto LAB_00123fcb;
        lVar15 = this->i_ + 1;
        this->i_ = lVar15;
      } while (lVar15 < lVar12);
    }
    bVar17 = lVar15 != this->size_;
  }
  else {
LAB_00123fd4:
    bVar17 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar17;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObject* item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj, &item_data, &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          item_obj);
      return true;
    };
    Py_ssize_t const max = std::min(i_ + batch_size(), size_);
    for (; i_ < max; i_++) {
      if (!add_item(PyList_GetItem(list_, i_))) {
        done_ = true;
        return false;
      }
    }
    return i_ != size_;
  }